

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O3

bool __thiscall
draco::AttributeQuantizationTransform::DecodeParameters
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          DecoderBuffer *decoder_buffer)

{
  long lVar1;
  byte bVar2;
  pointer __dest;
  long lVar3;
  size_t __n;
  
  std::vector<float,_std::allocator<float>_>::resize
            (&this->min_values_,(ulong)(attribute->super_GeometryAttribute).num_components_);
  __dest = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)(this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__dest;
  if ((long)(decoder_buffer->pos_ + __n) <= decoder_buffer->data_size_) {
    memcpy(__dest,decoder_buffer->data_ + decoder_buffer->pos_,__n);
    lVar3 = decoder_buffer->pos_;
    lVar1 = lVar3 + __n;
    decoder_buffer->pos_ = lVar1;
    if ((long)(lVar3 + __n + 4) <= decoder_buffer->data_size_) {
      this->range_ = *(float *)(decoder_buffer->data_ + lVar1);
      lVar3 = decoder_buffer->pos_;
      lVar1 = lVar3 + 4;
      decoder_buffer->pos_ = lVar1;
      lVar3 = lVar3 + 5;
      if (lVar3 <= decoder_buffer->data_size_) {
        bVar2 = decoder_buffer->data_[lVar1];
        decoder_buffer->pos_ = lVar3;
        if (bVar2 - 1 < 0x1e) {
          this->quantization_bits_ = (uint)bVar2;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool AttributeQuantizationTransform::DecodeParameters(
    const PointAttribute &attribute, DecoderBuffer *decoder_buffer) {
  min_values_.resize(attribute.num_components());
  if (!decoder_buffer->Decode(&min_values_[0],
                              sizeof(float) * min_values_.size())) {
    return false;
  }
  if (!decoder_buffer->Decode(&range_)) {
    return false;
  }
  uint8_t quantization_bits;
  if (!decoder_buffer->Decode(&quantization_bits)) {
    return false;
  }
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;
  return true;
}